

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  byte bVar1;
  bool bVar2;
  Classifier CVar3;
  long lVar4;
  App *this_00;
  Option *pOVar5;
  Classifier CVar6;
  string dummy2;
  string dummy1;
  string local_68;
  string local_48;
  
  dummy1._M_dataplus._M_p = (pointer)&dummy1.field_2;
  dummy1._M_string_length = 0;
  dummy1.field_2._M_local_buf[0] = '\0';
  dummy2._M_dataplus._M_p = (pointer)&dummy2.field_2;
  dummy2._M_string_length = 0;
  dummy2.field_2._M_local_buf[0] = '\0';
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            current,"--");
  CVar6 = POSITIONAL_MARK;
  if (bVar2) goto LAB_0012ad7b;
  bVar2 = _valid_subcommand(this,current,ignore_used_subcommands);
  CVar6 = SUBCOMMAND;
  if (bVar2) goto LAB_0012ad7b;
  bVar2 = detail::split_long(current,&dummy1,&dummy2);
  CVar6 = LONG;
  if (bVar2) goto LAB_0012ad7b;
  bVar2 = detail::split_short(current,&dummy1,&dummy2);
  if (bVar2) {
    bVar1 = *dummy1._M_dataplus._M_p;
    if ((char)bVar1 < 0x30) {
      if (((bVar1 == 0x2e) && (dummy2._M_string_length != 0)) &&
         ((byte)(*dummy2._M_dataplus._M_p - 0x30U) < 10)) goto LAB_0012ad34;
    }
    else if (bVar1 < 0x3a) {
LAB_0012ad34:
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_2_ = (short)(char)bVar1 << 8 | 0x2d;
      local_48._M_string_length = 2;
      local_48.field_2._M_local_buf[2] = '\0';
      pOVar5 = get_option_no_throw(this,&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      if (pOVar5 == (Option *)0x0) goto LAB_0012ad78;
    }
    CVar6 = SHORT;
  }
  else {
    if (this->allow_windows_style_options_ == true) {
      bVar2 = detail::split_windows_style(current,&dummy1,&dummy2);
      CVar6 = WINDOWS_STYLE;
      if (bVar2) goto LAB_0012ad7b;
    }
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              current,"++");
    if (((bVar2) && ((this->name_)._M_string_length != 0)) &&
       (CVar6 = SUBCOMMAND_TERMINATOR, this->parent_ != (App *)0x0)) goto LAB_0012ad7b;
    lVar4 = ::std::__cxx11::string::find((char)current,0x2e);
    if (lVar4 != -1) {
      ::std::__cxx11::string::substr((ulong)&local_68,(ulong)current);
      this_00 = _find_subcommand(this,&local_68,true,ignore_used_subcommands);
      ::std::__cxx11::string::~string((string *)&local_68);
      if (this_00 != (App *)0x0) {
        ::std::__cxx11::string::substr((ulong)&local_68,(ulong)current);
        CVar3 = _recognize(this_00,&local_68,ignore_used_subcommands);
        ::std::__cxx11::string::~string((string *)&local_68);
        CVar6 = SUBCOMMAND;
        if (CVar3 == SUBCOMMAND) goto LAB_0012ad7b;
      }
    }
LAB_0012ad78:
    CVar6 = NONE;
  }
LAB_0012ad7b:
  ::std::__cxx11::string::~string((string *)&dummy2);
  ::std::__cxx11::string::~string((string *)&dummy1);
  return CVar6;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if((dummy1[0] >= '0' && dummy1[0] <= '9') ||
           (dummy1[0] == '.' && !dummy2.empty() && (dummy2[0] >= '0' && dummy2[0] <= '9'))) {
            // it looks like a number but check if it could be an option
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}